

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::SetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  double dVar6;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  uVar5 = j * this->m_cv_stride[1] + i * this->m_cv_stride[0];
  if ((int)uVar5 < 0 || this->m_cv == (double *)0x0) {
    bVar4 = false;
  }
  else {
    pdVar1 = this->m_cv + uVar5;
    if (this->m_is_rat == 0) {
      dVar2 = point->w;
      bVar4 = (bool)(-(dVar2 != 0.0) & 1);
      dVar6 = 1.0 / dVar2;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        dVar6 = 1.0;
      }
      *pdVar1 = point->x * dVar6;
      iVar3 = this->m_dim;
      if ((1 < iVar3) && (pdVar1[1] = point->y * dVar6, iVar3 != 2)) {
        pdVar1[2] = dVar6 * point->z;
      }
    }
    else {
      *pdVar1 = point->x;
      iVar3 = this->m_dim;
      if ((1 < (long)iVar3) && (pdVar1[1] = point->y, iVar3 != 2)) {
        pdVar1[2] = point->z;
      }
      pdVar1[iVar3] = point->w;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool 
ON_NurbsSurface::SetCV( int i, int j, const ON_4dPoint& point )
{
  DestroySurfaceTree();

  bool rc = false;
  double* cv = CV(i,j);
  if ( cv ) {
    if ( m_is_rat ) {
      cv[0] = point.x;
      if ( m_dim > 1 ) {
        cv[1] = point.y;
        if ( m_dim > 2 )
          cv[2] = point.z;
      }
      cv[m_dim] = point.w;
      rc = true;
    }
    else {
      double w;
      if ( point.w != 0.0 ) {
        w = 1.0/point.w;
        rc = true;
      }
      else {
        w = 1.0;
      }
      cv[0] = w*point.x;
      if ( m_dim > 1 ) {
        cv[1] = w*point.y;
        if ( m_dim > 2 ) {
          cv[2] = w*point.z;
        }
      }
    }
  }
  return rc;
}